

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

substr c4::decode_code_point(substr out,csubstr code_point)

{
  ro_substr pattern;
  ro_substr pattern_00;
  ro_substr pattern_01;
  ro_substr pattern_02;
  substr sVar1;
  bool bVar2;
  error_flags eVar3;
  size_t sVar4;
  ulong in_RCX;
  char *in_RDX;
  ulong in_RSI;
  size_t ret;
  uint32_t code_point_val;
  uint cv;
  char c;
  iterator __end2;
  iterator __begin2;
  csubstr *__range2;
  undefined8 in_stack_fffffffffffffe08;
  uint32_t code;
  undefined7 in_stack_fffffffffffffe10;
  undefined1 in_stack_fffffffffffffe17;
  basic_substring<const_char> *in_stack_fffffffffffffe18;
  char *s_;
  undefined6 in_stack_fffffffffffffe20;
  undefined1 in_stack_fffffffffffffe26;
  undefined1 uVar5;
  undefined1 in_stack_fffffffffffffe27;
  size_t in_stack_fffffffffffffe28;
  bool local_1c9;
  int local_18c;
  char *local_188;
  undefined4 local_180;
  char *local_178;
  undefined4 local_170;
  char *local_168;
  undefined4 local_160;
  char *local_158;
  undefined4 local_150;
  basic_substring<char_const> local_148 [16];
  char *local_138;
  undefined4 local_130;
  basic_substring<char_const> local_128 [16];
  char *local_118;
  undefined4 local_110;
  basic_substring<char_const> local_108 [16];
  char *local_f8;
  undefined4 local_f0;
  basic_substring<char_const> local_e8 [16];
  char *local_d8;
  undefined4 local_d0;
  basic_substring<const_char> local_c8;
  char local_b8 [8];
  ulong local_b0;
  int local_98;
  char local_91;
  char *local_90;
  char *local_88;
  char **local_80;
  char *local_78;
  undefined4 local_70;
  int *local_68;
  char *local_60;
  ulong local_58;
  byte local_49;
  char **local_48;
  char **local_40;
  char *local_38;
  undefined4 local_30;
  size_t local_28;
  char *local_20;
  char *local_18;
  size_t local_10;
  char **local_8;
  
  code = (uint32_t)((ulong)in_stack_fffffffffffffe08 >> 0x20);
  local_c8.str = in_RDX;
  local_c8.len = in_RCX;
  local_b0 = in_RSI;
  if (in_RSI < 4) {
    eVar3 = get_error_flags();
    if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
      trap_instruction();
    }
    local_d8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_d0 = 0x4525;
    handle_error(0x345f1b,(char *)0x4525,"check failed: %s","out.len >= 4");
  }
  basic_substring<char_const>::basic_substring<3ul>(local_e8,(char (*) [3])"U+");
  pattern.str._6_1_ = in_stack_fffffffffffffe26;
  pattern.str._0_6_ = in_stack_fffffffffffffe20;
  pattern.str._7_1_ = in_stack_fffffffffffffe27;
  pattern.len = in_stack_fffffffffffffe28;
  bVar2 = basic_substring<const_char>::begins_with(in_stack_fffffffffffffe18,pattern);
  if (bVar2) {
    eVar3 = get_error_flags();
    if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
      trap_instruction();
    }
    local_f8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_f0 = 0x4526;
    handle_error(0x345f1b,(char *)0x4526,"check failed: %s","!code_point.begins_with(\"U+\")");
  }
  basic_substring<char_const>::basic_substring<3ul>(local_108,(char (*) [3])"\\x");
  pattern_00.str._6_1_ = in_stack_fffffffffffffe26;
  pattern_00.str._0_6_ = in_stack_fffffffffffffe20;
  pattern_00.str._7_1_ = in_stack_fffffffffffffe27;
  pattern_00.len = in_stack_fffffffffffffe28;
  bVar2 = basic_substring<const_char>::begins_with(in_stack_fffffffffffffe18,pattern_00);
  if (bVar2) {
    eVar3 = get_error_flags();
    if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
      trap_instruction();
    }
    local_118 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_110 = 0x4527;
    handle_error(0x345f1b,(char *)0x4527,"check failed: %s","!code_point.begins_with(\"\\\\x\")");
  }
  basic_substring<char_const>::basic_substring<3ul>(local_128,(char (*) [3])"\\u");
  pattern_01.str._6_1_ = in_stack_fffffffffffffe26;
  pattern_01.str._0_6_ = in_stack_fffffffffffffe20;
  pattern_01.str._7_1_ = in_stack_fffffffffffffe27;
  pattern_01.len = in_stack_fffffffffffffe28;
  bVar2 = basic_substring<const_char>::begins_with(in_stack_fffffffffffffe18,pattern_01);
  if (bVar2) {
    eVar3 = get_error_flags();
    if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
      trap_instruction();
    }
    local_138 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_130 = 0x4528;
    handle_error(0x345f1b,(char *)0x4528,"check failed: %s","!code_point.begins_with(\"\\\\u\")");
  }
  basic_substring<char_const>::basic_substring<3ul>(local_148,(char (*) [3])"\\U");
  pattern_02.str._6_1_ = in_stack_fffffffffffffe26;
  pattern_02.str._0_6_ = in_stack_fffffffffffffe20;
  pattern_02.str._7_1_ = in_stack_fffffffffffffe27;
  pattern_02.len = in_stack_fffffffffffffe28;
  bVar2 = basic_substring<const_char>::begins_with(in_stack_fffffffffffffe18,pattern_02);
  if (bVar2) {
    eVar3 = get_error_flags();
    if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
      trap_instruction();
    }
    local_158 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_150 = 0x4529;
    handle_error(0x345f1b,(char *)0x4529,"check failed: %s","!code_point.begins_with(\"\\\\U\")");
  }
  bVar2 = basic_substring<const_char>::begins_with(&local_c8,'0');
  if (bVar2) {
    eVar3 = get_error_flags();
    if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
      trap_instruction();
    }
    local_168 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_160 = 0x452a;
    handle_error(0x345f1b,(char *)0x452a,"check failed: %s","!code_point.begins_with(\'0\')");
  }
  if (8 < local_c8.len) {
    eVar3 = get_error_flags();
    if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
      trap_instruction();
    }
    local_178 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_170 = 0x452b;
    handle_error(0x345f1b,(char *)0x452b,"check failed: %s","code_point.len <= 8");
  }
  if (local_c8.len == 0) {
    eVar3 = get_error_flags();
    if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
      trap_instruction();
    }
    local_188 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_180 = 0x452c;
    handle_error(0x345f1b,(char *)0x452c,"check failed: %s","code_point.len > 0");
  }
  local_60 = local_c8.str;
  local_58 = local_c8.len;
  local_68 = &local_18c;
  local_8 = &local_60;
  local_1c9 = local_c8.len == 0 || local_c8.str == (char *)0x0;
  if (local_1c9) {
    eVar3 = get_error_flags();
    if (((eVar3 & 1) != 0) &&
       (in_stack_fffffffffffffe27 = is_debugger_attached(), (bool)in_stack_fffffffffffffe27)) {
      trap_instruction();
    }
    local_78 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_70 = 0x2cac;
    handle_error(0x345f1b,(char *)0x2cac,"check failed: %s","!s.empty()");
  }
  *local_68 = 0;
  local_80 = &local_60;
  local_88 = local_60;
  local_90 = local_60 + local_58;
  local_48 = local_80;
  local_40 = local_80;
  do {
    if (local_88 == local_90) {
      local_49 = 1;
LAB_002d68c7:
      if (((local_49 ^ 0xff) & 1) != 0) {
        eVar3 = get_error_flags();
        if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
          trap_instruction();
        }
        handle_error(0x345f1b,(char *)0x452e,"check failed: %s",
                     "read_hex(code_point, &code_point_val)");
      }
      sVar4 = decode_code_point((uint8_t *)in_stack_fffffffffffffe18,
                                CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10),code);
      if (4 < sVar4) {
        eVar3 = get_error_flags();
        if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
          trap_instruction();
        }
        handle_error(0x345f1b,(char *)0x4530,"check failed: %s","ret <= 4");
      }
      s_ = local_b8;
      uVar5 = sVar4 <= local_b0 || sVar4 == 0xffffffffffffffff;
      local_28 = sVar4;
      local_20 = s_;
      if (sVar4 > local_b0 && sVar4 != 0xffffffffffffffff) {
        eVar3 = get_error_flags();
        if (((eVar3 & 1) != 0) &&
           (in_stack_fffffffffffffe17 = is_debugger_attached(), (bool)in_stack_fffffffffffffe17)) {
          trap_instruction();
        }
        local_38 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_30 = 0x154e;
        handle_error(0x345f1b,(char *)0x154e,"check failed: %s","num <= len || num == npos");
      }
      basic_substring<char>::basic_substring
                ((basic_substring<char> *)
                 CONCAT17(in_stack_fffffffffffffe27,CONCAT16(uVar5,in_stack_fffffffffffffe20)),s_,
                 CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10));
      sVar1.len = local_10;
      sVar1.str = local_18;
      return sVar1;
    }
    local_91 = *local_88;
    if ((local_91 < '0') || ('9' < local_91)) {
      if ((local_91 < 'a') || ('f' < local_91)) {
        if ((local_91 < 'A') || ('F' < local_91)) {
          local_49 = 0;
          goto LAB_002d68c7;
        }
        local_98 = local_91 + -0x37;
      }
      else {
        local_98 = local_91 + -0x57;
      }
    }
    else {
      local_98 = local_91 + -0x30;
    }
    *local_68 = *local_68 * 0x10 + local_98;
    local_88 = local_88 + 1;
  } while( true );
}

Assistant:

substr decode_code_point(substr out, csubstr code_point)
{
    C4_ASSERT(out.len >= 4);
    C4_ASSERT(!code_point.begins_with("U+"));
    C4_ASSERT(!code_point.begins_with("\\x"));
    C4_ASSERT(!code_point.begins_with("\\u"));
    C4_ASSERT(!code_point.begins_with("\\U"));
    C4_ASSERT(!code_point.begins_with('0'));
    C4_ASSERT(code_point.len <= 8);
    C4_ASSERT(code_point.len > 0);
    uint32_t code_point_val;
    C4_CHECK(read_hex(code_point, &code_point_val));
    size_t ret = decode_code_point((uint8_t*)out.str, out.len, code_point_val);
    C4_ASSERT(ret <= 4);
    return out.first(ret);
}